

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall Lodtalk::AST::PragmaList::~PragmaList(PragmaList *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaList_00170278;
  ppPVar1 = (this->pragmas).
            super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->pragmas).
                 super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1;
      ppPVar2 = ppPVar2 + 1) {
    if (*ppPVar2 != (PragmaDefinition *)0x0) {
      (*((*ppPVar2)->super_Node)._vptr_Node[1])();
    }
  }
  std::
  _Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
  ::~_Vector_base(&(this->pragmas).
                   super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                 );
  return;
}

Assistant:

PragmaList::~PragmaList()
{
    for(auto pragma : pragmas)
        delete pragma;
}